

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  int iVar1;
  cJSON *pcVar2;
  char *pcVar3;
  void *__s_00;
  void *__s_01;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int needed;
  size_t __n;
  cJSON *item_00;
  bool bVar12;
  int local_5c;
  
  item_00 = (cJSON *)&item->child;
  __n = 0xfffffffffffffff8;
  uVar10 = 0;
  pcVar2 = item_00;
  do {
    pcVar2 = pcVar2->next;
    uVar10 = uVar10 - 1;
    __n = __n + 8;
  } while (pcVar2 != (cJSON *)0x0);
  if ((int)uVar10 == -1) {
    if (p == (printbuffer *)0x0) {
      iVar9 = 3;
      if (fmt != 0) {
        iVar9 = depth + 4;
      }
      pcVar3 = (char *)(*cJSON_malloc)((long)iVar9);
    }
    else {
      iVar9 = 3;
      if (fmt != 0) {
        iVar9 = depth + 4;
      }
      pcVar3 = ensure(p,iVar9);
    }
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '{';
      if (fmt == 0) {
        pcVar5 = pcVar3 + 1;
      }
      else {
        pcVar5 = pcVar3 + 2;
        pcVar3[1] = '\n';
        iVar9 = 0;
        if (0 < depth) {
          iVar9 = depth;
        }
        while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
          *pcVar5 = '\t';
          pcVar5 = pcVar5 + 1;
        }
      }
      pcVar5[0] = '}';
      pcVar5[1] = '\0';
      return pcVar3;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n);
    if (__s_00 != (void *)0x0) {
      __s_01 = (*cJSON_malloc)(__n);
      if (__s_01 != (void *)0x0) {
        uVar4 = ~uVar10;
        lVar8 = 0;
        memset(__s_00,0,__n);
        memset(__s_01,0,__n);
        local_5c = depth + 8;
        iVar9 = depth + 5;
        if (fmt == 0) {
          iVar9 = 2;
          local_5c = 7;
        }
LAB_001041a8:
        bVar12 = true;
LAB_001041ab:
        if ((bVar12) && (item_00 = item_00->next, item_00 != (cJSON *)0x0)) goto code_r0x001041c1;
        if ((bVar12) &&
           (pcVar3 = (char *)(*cJSON_malloc)((long)local_5c), (bool)(bVar12 & pcVar3 != (char *)0x0)
           )) {
          *pcVar3 = '{';
          if (fmt == 0) {
            pcVar5 = pcVar3 + 1;
          }
          else {
            pcVar5 = pcVar3 + 2;
            pcVar3[1] = '\n';
          }
          *pcVar5 = '\0';
          for (uVar4 = 0; ~uVar10 != uVar4; uVar4 = uVar4 + 1) {
            if (fmt != 0) {
              for (lVar8 = 0; (int)lVar8 <= depth; lVar8 = lVar8 + 1) {
                pcVar5[lVar8] = '\t';
              }
              pcVar5 = pcVar5 + lVar8;
            }
            __s = *(char **)((long)__s_01 + uVar4 * 8);
            sVar6 = strlen(__s);
            memcpy(pcVar5,__s,sVar6);
            pcVar5[sVar6] = ':';
            if (fmt == 0) {
              lVar8 = sVar6 + 1;
            }
            else {
              pcVar5[sVar6 + 1] = '\t';
              lVar8 = sVar6 + 2;
            }
            strcpy(pcVar5 + lVar8,*(char **)((long)__s_00 + uVar4 * 8));
            sVar6 = strlen(*(char **)((long)__s_00 + uVar4 * 8));
            pcVar5 = pcVar5 + lVar8 + sVar6;
            if (uVar4 != -(int)uVar10 - 2) {
              *pcVar5 = ',';
              pcVar5 = pcVar5 + 1;
            }
            if (fmt != 0) {
              *pcVar5 = '\n';
              pcVar5 = pcVar5 + 1;
            }
            *pcVar5 = '\0';
            (*cJSON_free)(*(void **)((long)__s_01 + uVar4 * 8));
            (*cJSON_free)(*(void **)((long)__s_00 + uVar4 * 8));
          }
          (*cJSON_free)(__s_01);
          (*cJSON_free)(__s_00);
          if (fmt != 0) {
            iVar9 = 0;
            if (0 < depth) {
              iVar9 = depth;
            }
            while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
              *pcVar5 = '\t';
              pcVar5 = pcVar5 + 1;
            }
          }
          pcVar5[0] = '}';
          pcVar5[1] = '\0';
          return pcVar3;
        }
        lVar8 = 0;
        while (bVar12 = uVar4 != 0, uVar4 = uVar4 - 1, bVar12) {
          if (*(void **)((long)__s_01 + lVar8) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_01 + lVar8));
          }
          if (*(void **)((long)__s_00 + lVar8) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_00 + lVar8));
          }
          lVar8 = lVar8 + 8;
        }
        (*cJSON_free)(__s_01);
      }
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar9 = p->offset;
    pcVar3 = ensure(p,(fmt != 0) + 2);
    if (pcVar3 != (char *)0x0) {
      iVar11 = (fmt != 0) + 1;
      *pcVar3 = '{';
      if (fmt == 0) {
        pcVar3 = pcVar3 + 1;
      }
      else {
        pcVar3[1] = '\n';
        pcVar3 = pcVar3 + 2;
      }
      *pcVar3 = '\0';
      p->offset = p->offset + iVar11;
      needed = depth + 1;
      while (item_00 = item_00->next, item_00 != (cJSON *)0x0) {
        if (fmt != 0) {
          pcVar3 = ensure(p,needed);
          if (pcVar3 == (char *)0x0) {
            return (char *)0x0;
          }
          for (lVar8 = 0; (int)lVar8 <= depth; lVar8 = lVar8 + 1) {
            pcVar3[lVar8] = '\t';
          }
          p->offset = p->offset + needed;
        }
        print_string_ptr(item_00->string,p);
        iVar1 = update(p);
        p->offset = iVar1;
        pcVar3 = ensure(p,iVar11);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        *pcVar3 = ':';
        if (fmt != 0) {
          pcVar3[1] = '\t';
        }
        p->offset = p->offset + iVar11;
        print_value(item_00,needed,fmt,p);
        iVar1 = update(p);
        p->offset = iVar1;
        iVar1 = ((fmt != 0) + 1) - (uint)(item_00->next == (cJSON *)0x0);
        pcVar3 = ensure(p,iVar1 + 1);
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        if (item_00->next != (cJSON *)0x0) {
          *pcVar3 = ',';
          pcVar3 = pcVar3 + 1;
        }
        if (fmt != 0) {
          *pcVar3 = '\n';
          pcVar3 = pcVar3 + 1;
        }
        *pcVar3 = '\0';
        p->offset = p->offset + iVar1;
      }
      iVar11 = 2;
      if (fmt != 0) {
        iVar11 = depth + 2;
      }
      pcVar3 = ensure(p,iVar11);
      if (pcVar3 != (char *)0x0) {
        if (fmt != 0) {
          iVar11 = 0;
          iVar9 = 0;
          if (0 < depth) {
            iVar11 = depth;
            iVar9 = depth;
          }
          while (iVar11 != 0) {
            *pcVar3 = '\t';
            pcVar3 = pcVar3 + 1;
            iVar11 = iVar11 + -1;
          }
        }
        pcVar3[0] = '}';
        pcVar3[1] = '\0';
        return p->buffer + iVar9;
      }
    }
  }
  return (char *)0x0;
code_r0x001041c1:
  bVar12 = false;
  pcVar3 = print_string_ptr(item_00->string,(printbuffer *)0x0);
  *(char **)((long)__s_01 + lVar8 * 8) = pcVar3;
  pcVar5 = print_value(item_00,depth + 1,fmt,(printbuffer *)0x0);
  *(char **)((long)__s_00 + lVar8 * 8) = pcVar5;
  lVar8 = lVar8 + 1;
  if (pcVar5 != (char *)0x0 && pcVar3 != (char *)0x0) goto code_r0x0010420c;
  goto LAB_001041ab;
code_r0x0010420c:
  sVar6 = strlen(pcVar5);
  sVar7 = strlen(pcVar3);
  local_5c = local_5c + iVar9 + (int)sVar7 + (int)sVar6;
  goto LAB_001041a8;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child && !fail)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}